

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_set_vert_loop_filter_done
               (AV1_COMMON *cm,AV1LfSync *lf_sync,int num_mis_in_lpf_unit_height_log2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  bVar5 = (byte)num_mis_in_lpf_unit_height_log2;
  iVar3 = (1 << (bVar5 & 0x1f)) + -1;
  iVar1 = (cm->mi_params).mi_cols;
  uVar4 = iVar3 + (cm->mi_params).mi_rows >> (bVar5 & 0x1f);
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      lVar7 = 0;
      do {
        iVar6 = lf_sync->sync_range + (iVar1 + iVar3 >> (bVar5 & 0x1f));
        pthread_mutex_lock((pthread_mutex_t *)(lf_sync->mutex_[lVar7] + uVar8));
        iVar2 = lf_sync->cur_sb_col[lVar7][uVar8];
        if (iVar6 < iVar2) {
          iVar6 = iVar2;
        }
        lf_sync->cur_sb_col[lVar7][uVar8] = iVar6;
        pthread_cond_broadcast((pthread_cond_t *)(lf_sync->cond_[lVar7] + uVar8));
        pthread_mutex_unlock((pthread_mutex_t *)(lf_sync->mutex_[lVar7] + uVar8));
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar4);
  }
  return;
}

Assistant:

void av1_set_vert_loop_filter_done(AV1_COMMON *cm, AV1LfSync *lf_sync,
                                   int num_mis_in_lpf_unit_height_log2) {
  int plane, sb_row;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, num_mis_in_lpf_unit_height_log2);
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, num_mis_in_lpf_unit_height_log2);

  // In case of loopfilter row-multithreading, the worker on an SB row waits for
  // the vertical edge filtering of the right and top-right SBs. Hence, in case
  // a thread (main/worker) encounters an error, update that vertical
  // loopfiltering of every SB row in the frame is complete in order to avoid
  // dependent workers waiting indefinitely.
  for (sb_row = 0; sb_row < sb_rows; ++sb_row)
    for (plane = 0; plane < MAX_MB_PLANE; ++plane)
      sync_write(lf_sync, sb_row, sb_cols - 1, sb_cols, plane);
}